

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ostream * duckdb_parquet::operator<<(ostream *out,type *val)

{
  const_iterator cVar1;
  type local_1c;
  
  local_1c = *val;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                  *)_ConvertedType_VALUES_TO_NAMES,(key_type_conflict4 *)&local_1c);
  if (cVar1._M_node == (_Base_ptr)(_ConvertedType_VALUES_TO_NAMES + 8)) {
    std::ostream::operator<<(out,*val);
  }
  else {
    std::operator<<(out,(char *)cVar1._M_node[1]._M_parent);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ConvertedType::type& val) {
  std::map<int, const char*>::const_iterator it = _ConvertedType_VALUES_TO_NAMES.find(val);
  if (it != _ConvertedType_VALUES_TO_NAMES.end()) {
    out << it->second;
  } else {
    out << static_cast<int>(val);
  }
  return out;
}